

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

uint8_t bcm2835_spi_transfer(uint8_t value)

{
  uint32_t *paddr;
  uint32_t uVar1;
  uint8_t uVar2;
  
  paddr = bcm2835_spi0;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr,0x80,0x80);
  do {
    uVar1 = bcm2835_peri_read(paddr);
  } while ((uVar1 >> 0x12 & 1) == 0);
  if (bcm2835_spi_bit_order == '\0') {
    value = ""[value];
  }
  bcm2835_peri_write_nb(paddr + 1,(uint)value);
  do {
    uVar1 = bcm2835_peri_read_nb(paddr);
  } while ((uVar1 >> 0x10 & 1) == 0);
  uVar1 = bcm2835_peri_read_nb(paddr + 1);
  uVar2 = (uint8_t)uVar1;
  if (bcm2835_spi_bit_order == '\0') {
    uVar2 = ""[(ulong)uVar1 & 0xff];
  }
  bcm2835_peri_set_bits(paddr,0,0x80);
  return uVar2;
}

Assistant:

uint8_t bcm2835_spi_transfer(uint8_t value)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t ret;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral? 
    // Clear TX and RX fifos
    */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    /* Maybe wait for TXD */
    while (!(bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))
	;

    /* Write to FIFO, no barrier */
    bcm2835_peri_write_nb(fifo, bcm2835_correct_order(value));

    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Read any byte that was sent back by the slave while we sere sending to it */
    ret = bcm2835_correct_order(bcm2835_peri_read_nb(fifo));

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);

    return ret;
}